

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Lexer::ErrorWriteDetails(Lexer *this)

{
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  unsigned_long *puVar4;
  byte local_a9;
  bool local_99;
  ulong local_90;
  size_t i_1;
  ulong local_80;
  size_t i;
  String markerText;
  undefined1 local_48 [8];
  String lineText;
  size_t whitespaceOffset;
  char *lineStart;
  char *current;
  Lexer *this_local;
  
  whitespaceOffset = (size_t)this->m_start;
  for (lineStart = this->m_start; lineStart < this->m_current; lineStart = lineStart + 1) {
    bVar2 = IsNewline(this,*lineStart);
    if (bVar2) {
      whitespaceOffset = (size_t)(lineStart + 1);
    }
  }
  lineText.field_2._8_8_ = 0;
  while( true ) {
    local_99 = false;
    if (whitespaceOffset < this->m_current) {
      local_99 = IsWhitespace(this,*(uchar *)whitespaceOffset);
    }
    if (local_99 == false) break;
    if (*(char *)whitespaceOffset == '\t') {
      lineText.field_2._8_8_ = lineText.field_2._8_8_ + 4;
    }
    else {
      lineText.field_2._8_8_ = lineText.field_2._8_8_ + 1;
    }
    whitespaceOffset = whitespaceOffset + 1;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_48);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_48,0x20);
  while( true ) {
    local_a9 = 0;
    if (whitespaceOffset < this->m_end) {
      bVar2 = IsNewline(this,*(uchar *)whitespaceOffset);
      local_a9 = bVar2 ^ 0xff;
    }
    if ((local_a9 & 1) == 0) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_48,
               *(char *)whitespaceOffset);
    whitespaceOffset = whitespaceOffset + 1;
  }
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_48
                     );
  LogWriteLine(Error,pcVar3);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&i);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&i,0x20);
  local_80 = 0;
  while( true ) {
    uVar1 = local_80;
    i_1 = (size_t)this->m_columnMarker;
    puVar4 = std::max<unsigned_long>(&i_1,(unsigned_long *)(lineText.field_2._M_local_buf + 8));
    if (*puVar4 - lineText.field_2._8_8_ <= uVar1) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&i," ");
    local_80 = local_80 + 1;
  }
  for (local_90 = 0; local_90 < 3; local_90 = local_90 + 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&i,"^");
  }
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&i);
  LogWriteLine(Error,pcVar3);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&i);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_48);
  return;
}

Assistant:

inline_t void Lexer::ErrorWriteDetails() const
	{
		// Get line start position
		const char * current = m_start;
		const char * lineStart = m_start;
		while (current < m_current)
		{
			if (IsNewline(*current))
				lineStart = current + 1;
			++current;
		}
		size_t whitespaceOffset = 0;
		while (lineStart < m_current && IsWhitespace(*lineStart))
		{
			if (*lineStart == '\t')
				whitespaceOffset += 4;
			else
				++whitespaceOffset;
			++lineStart;
		}

		// Find line end
		String lineText;
		lineText.reserve(32);
		while (lineStart < m_end && !IsNewline(*lineStart))
		{
			lineText += *lineStart;
			++lineStart;
		}

		// Write line text
		LogWriteLine(LogLevel::Error, lineText.c_str());

		// Write marker showing location of error
		String markerText;
		markerText.reserve(32);
		for (size_t i = 0; i < std::max(size_t(m_columnMarker), whitespaceOffset) - whitespaceOffset; ++i)
			markerText += " ";
		for (size_t i = 0; i < 3; ++i)
			markerText += "^";
		LogWriteLine(LogLevel::Error, markerText.c_str());
	}